

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

domain_manager * __thiscall
cs::domain_manager::add_buildin_type<char_const(&)[7]>
          (domain_manager *this,char (*name) [7],function<cs_impl::any_()> *func,type_index *id,
          namespace_t *ext)

{
  domain_manager *pdVar1;
  type_index *in_RSI;
  shared_ptr<cs::name_space> *in_RDI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  var *in_stack_000000f0;
  char (*in_stack_000000f8) [7];
  domain_manager *in_stack_00000100;
  char (*in_stack_ffffffffffffff58) [7];
  function<cs_impl::any_()> *args;
  allocator<char> local_49;
  undefined8 in_stack_ffffffffffffffb8;
  domain_manager *in_stack_ffffffffffffffc0;
  
  args = (function<cs_impl::any_()> *)&local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,(char *)in_RSI,(allocator *)args);
  add_record(in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator(&local_49);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace<const_char_(&)[7],_0>(in_R8,in_stack_ffffffffffffff58);
  cs_impl::any::
  make_protect<cs::type_t,std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
            (args,in_RSI,in_RDI);
  pdVar1 = add_var<char_const(&)[7]>(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  cs_impl::any::~any((any *)0x214c07);
  return pdVar1;
}

Assistant:

domain_manager &
		add_buildin_type(T &&name, const std::function<var()> &func, const std::type_index &id, namespace_t ext)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var(name, var::make_protect<type_t>(func, id, ext));
		}